

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

Abc_Des_t * Ver_ParseFile(char *pFileName,Abc_Des_t *pGateLib,int fCheck,int fUseMemMan)

{
  Mio_Library_t *pLib;
  void *__ptr;
  FILE *pFile;
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Ver_Man_t *pMan;
  Ver_Stream_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Abc_Des_t *pAVar10;
  void *pvVar11;
  ProgressBar *pPVar12;
  char *pcVar13;
  Abc_Ntk_t *pAVar14;
  Mio_Gate_t *pGate;
  Abc_Ntk_t *pNtkBox;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar15;
  Abc_Obj_t *pAVar16;
  Ver_Bundle_t *pBundle0;
  Ver_SignalType_t SigType;
  Ver_GateType_t GateType;
  char *pcVar17;
  long lVar18;
  int Counter;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  
  pMan = (Ver_Man_t *)malloc(0x840);
  memset(pMan,0,0x840);
  pMan->pFileName = pFileName;
  pVVar5 = Ver_StreamAlloc(pFileName);
  pMan->pReader = pVVar5;
  if (pVVar5 == (Ver_Stream_t *)0x0) {
    if (pMan != (Ver_Man_t *)0x0) {
      free(pMan);
    }
    pMan = (Ver_Man_t *)0x0;
  }
  else {
    pMan->Output = _stdout;
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    ppvVar7 = (void **)malloc(800);
    pVVar6->pArray = ppvVar7;
    pMan->vNames = pVVar6;
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    ppvVar7 = (void **)malloc(800);
    pVVar6->pArray = ppvVar7;
    pMan->vStackFn = pVVar6;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 100;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(400);
    pVVar8->pArray = piVar9;
    pMan->vStackOp = pVVar8;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 100;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(400);
    pVVar8->pArray = piVar9;
    pMan->vPerm = pVVar8;
    pAVar10 = Abc_DesCreate(pFileName);
    pMan->pDesign = pAVar10;
    pAVar10->pLibrary = pGateLib;
    pvVar11 = Abc_FrameReadLibGen();
    pAVar10->pGenlib = pvVar11;
  }
  iVar2 = glo_fMapped;
  pMan->fMapped = glo_fMapped;
  pMan->fCheck = fCheck;
  pMan->fUseMemMan = fUseMemMan;
  if (iVar2 != 0) {
    Hop_ManStop((Hop_Man_t *)pMan->pDesign->pManFunc);
    pMan->pDesign->pManFunc = (void *)0x0;
  }
  pFile = _stdout;
  iVar2 = Ver_StreamGetFileSize(pMan->pReader);
  pPVar12 = Extra_ProgressBarStart(pFile,iVar2);
  pMan->pProgress = pPVar12;
  pcVar13 = Ver_ParseGetName(pMan);
  if (pcVar13 != (char *)0x0) {
LAB_002ea24d:
    iVar2 = strcmp(pcVar13,"module");
    if (iVar2 == 0) {
      pVVar5 = pMan->pReader;
      pcVar13 = Ver_ParseGetName(pMan);
      pAVar14 = Ver_ParseFindOrCreateNetwork(pMan,pcVar13);
      cVar1 = Ver_StreamPopChar(pVVar5);
      if (cVar1 != '(') {
        pcVar17 = pAVar14->pName;
        pcVar13 = "Cannot find \"(\" after \"module\" in network %s.";
        goto LAB_002ea94d;
      }
      do {
        pcVar13 = Ver_ParseGetName(pMan);
        if (pcVar13 == (char *)0x0) goto LAB_002ea97f;
        cVar1 = Ver_StreamPopChar(pVVar5);
      } while (cVar1 == ',');
      if (cVar1 != ')') {
        __assert_fail("Symbol == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                      ,0x1ad,"int Ver_ParseModule(Ver_Man_t *)");
      }
      iVar2 = Ver_ParseSkipComments(pMan);
      if (iVar2 == 0) goto LAB_002ea97f;
      cVar1 = Ver_StreamPopChar(pVVar5);
      if (cVar1 == ';') {
        do {
          pPVar12 = pMan->pProgress;
          iVar2 = Ver_StreamGetCurPosition(pVVar5);
          if ((pPVar12 == (ProgressBar *)0x0) || (pPVar12->nItemsNext <= iVar2)) {
            Extra_ProgressBarUpdate_int(pPVar12,iVar2,(char *)0x0);
          }
          pcVar13 = Ver_ParseGetName(pMan);
          if (pcVar13 == (char *)0x0) goto LAB_002ea97f;
          iVar2 = strcmp(pcVar13,"input");
          if (iVar2 == 0) {
            SigType = VER_SIG_INPUT;
          }
          else {
            iVar2 = strcmp(pcVar13,"output");
            if (iVar2 == 0) {
              SigType = VER_SIG_OUTPUT;
            }
            else {
              iVar2 = strcmp(pcVar13,"reg");
              if (iVar2 == 0) {
                SigType = VER_SIG_REG;
              }
              else {
                iVar2 = strcmp(pcVar13,"wire");
                if (iVar2 == 0) {
                  SigType = VER_SIG_WIRE;
                }
                else {
                  iVar2 = strcmp(pcVar13,"inout");
                  SigType = VER_SIG_INOUT;
                  if (iVar2 != 0) goto LAB_002ea39b;
                }
              }
            }
          }
          iVar2 = Ver_ParseSignal(pMan,pAVar14,SigType);
          if (iVar2 == 0) goto LAB_002ea97f;
        } while( true );
      }
      builtin_strncpy(pcVar17 + 0x10," parenthesis after \"module\".",0x1d);
      pcVar17 = pMan->sError;
      uVar19._0_1_ = 'E';
      uVar19._1_1_ = 'x';
      uVar19._2_1_ = 'p';
      uVar19._3_1_ = 'e';
      uVar20._0_1_ = 'c';
      uVar20._1_1_ = 't';
      uVar20._2_1_ = 'e';
      uVar20._3_1_ = 'd';
      uVar21._0_1_ = ' ';
      uVar21._1_1_ = 'c';
      uVar21._2_1_ = 'l';
      uVar21._3_1_ = 'o';
      uVar22._0_1_ = 's';
      uVar22._1_1_ = 'i';
      uVar22._2_1_ = 'n';
      uVar22._3_1_ = 'g';
    }
    else {
      builtin_strncpy(pMan->sError + 0x10,"ule\" directive.",0x10);
      uVar19._0_1_ = 'C';
      uVar19._1_1_ = 'a';
      uVar19._2_1_ = 'n';
      uVar19._3_1_ = 'n';
      uVar20._0_1_ = 'o';
      uVar20._1_1_ = 't';
      uVar20._2_1_ = ' ';
      uVar20._3_1_ = 'r';
      uVar21._0_1_ = 'e';
      uVar21._1_1_ = 'a';
      uVar21._2_1_ = 'd';
      uVar21._3_1_ = ' ';
      uVar22._0_1_ = '\"';
      uVar22._1_1_ = 'm';
      uVar22._2_1_ = 'o';
      uVar22._3_1_ = 'd';
    }
    *(undefined4 *)pMan->sError = uVar19;
    *(undefined4 *)(pMan->sError + 4) = uVar20;
    *(undefined4 *)(pMan->sError + 8) = uVar21;
    *(undefined4 *)(pMan->sError + 0xc) = uVar22;
    goto LAB_002ea977;
  }
LAB_002ea766:
  Extra_ProgressBarStop(pMan->pProgress);
  pMan->pProgress = (ProgressBar *)0x0;
  uVar3 = Ver_ParseConnectDefBoxes(pMan);
  if (1 < uVar3) {
    Ver_ParseReportUndefBoxes(pMan);
    pVVar6 = Ver_ParseCollectUndefBoxes(pMan);
    if (pVVar6->nSize < 1) {
      __assert_fail("Vec_PtrSize( vUndefs ) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                    ,0xb4c,"int Ver_ParseAttachBoxes(Ver_Man_t *)");
    }
    iVar2 = Ver_ParseMaxBoxSize(pVVar6);
    pAVar14 = (Abc_Ntk_t *)0x0;
    Counter = 0;
LAB_002ea7b9:
    for (; (iVar4 = Ver_ParseCheckNondrivenNets(pVVar6), iVar4 != 0 && (Counter < iVar2));
        Counter = Counter + 1) {
      iVar4 = pVVar6->nSize;
      if ((long)iVar4 < 1) {
        pBundle0 = (Ver_Bundle_t *)0x0;
      }
      else {
        ppvVar7 = pVVar6->pArray;
        lVar18 = 0;
        do {
          pAVar14 = (Abc_Ntk_t *)ppvVar7[lVar18];
          pBundle0 = Ver_ParseGetNondrivenBundle(pAVar14,Counter);
          if (pBundle0 != (Ver_Bundle_t *)0x0) goto LAB_002ea803;
          lVar18 = lVar18 + 1;
        } while (iVar4 != lVar18);
        pBundle0 = (Ver_Bundle_t *)0x0;
      }
LAB_002ea803:
      if (pBundle0 != (Ver_Bundle_t *)0x0) goto code_r0x002ea808;
    }
    iVar2 = Ver_ParseDriveInputs(pMan,pVVar6);
    if (iVar2 != 0) {
      iVar2 = pVVar6->nSize;
      if (0 < (long)iVar2) {
        ppvVar7 = pVVar6->pArray;
        lVar18 = 0;
        do {
          pvVar11 = ppvVar7[lVar18];
          __ptr = *(void **)((long)pvVar11 + 0x158);
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          *(undefined8 *)((long)pvVar11 + 0x158) = 0;
          lVar18 = lVar18 + 1;
        } while (iVar2 != lVar18);
      }
      if (pVVar6->pArray != (void **)0x0) {
        free(pVVar6->pArray);
        pVVar6->pArray = (void **)0x0;
      }
      uVar3 = 1;
      if (pVVar6 != (Vec_Ptr_t *)0x0) {
        free(pVVar6);
      }
      goto LAB_002ea8bd;
    }
    goto LAB_002ea8bb;
  }
LAB_002ea8bd:
  if ((uVar3 != 0) && (pVVar6 = pMan->pDesign->vModules, 0 < pVVar6->nSize)) {
    lVar18 = 0;
    do {
      pAVar14 = (Abc_Ntk_t *)pVVar6->pArray[lVar18];
      Abc_NtkFinalizeRead(pAVar14);
      if ((pMan->fCheck != 0) && (iVar2 = Abc_NtkCheckRead(pAVar14), iVar2 == 0)) {
        pMan->fTopLevel = 1;
        pcVar17 = pAVar14->pName;
        pcVar13 = "The network check has failed for network %s.";
LAB_002ea94d:
        sprintf(pMan->sError,pcVar13,pcVar17);
LAB_002ea977:
        Ver_ParsePrintErrorMessage(pMan);
        break;
      }
      lVar18 = lVar18 + 1;
      pVVar6 = pMan->pDesign->vModules;
    } while (lVar18 < pVVar6->nSize);
  }
LAB_002ea97f:
  pAVar10 = pMan->pDesign;
  pMan->pDesign = (Abc_Des_t *)0x0;
  if (pMan->pProgress != (ProgressBar *)0x0) {
    Extra_ProgressBarStop(pMan->pProgress);
  }
  Ver_StreamFree(pMan->pReader);
  pVVar6 = pMan->vNames;
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = pMan->vStackFn;
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar8 = pMan->vStackOp;
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  if (pVVar8 != (Vec_Int_t *)0x0) {
    free(pVVar8);
  }
  pVVar8 = pMan->vPerm;
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  if (pVVar8 != (Vec_Int_t *)0x0) {
    free(pVVar8);
  }
  if (pMan != (Ver_Man_t *)0x0) {
    free(pMan);
  }
  return pAVar10;
LAB_002ea39b:
  pPVar12 = pMan->pProgress;
  iVar2 = Ver_StreamGetCurPosition(pVVar5);
  if ((pPVar12 == (ProgressBar *)0x0) || (pPVar12->nItemsNext <= iVar2)) {
    Extra_ProgressBarUpdate_int(pPVar12,iVar2,(char *)0x0);
  }
  iVar2 = strcmp(pcVar13,"and");
  if (iVar2 == 0) {
    GateType = VER_GATE_AND;
LAB_002ea580:
    iVar2 = Ver_ParseGateStandard(pMan,pAVar14,GateType);
  }
  else {
    iVar2 = strcmp(pcVar13,"or");
    if (iVar2 == 0) {
      GateType = VER_GATE_OR;
      goto LAB_002ea580;
    }
    iVar2 = strcmp(pcVar13,"xor");
    if (iVar2 == 0) {
      GateType = VER_GATE_XOR;
      goto LAB_002ea580;
    }
    iVar2 = strcmp(pcVar13,"buf");
    if (iVar2 == 0) {
      GateType = VER_GATE_BUF;
      goto LAB_002ea580;
    }
    iVar2 = strcmp(pcVar13,"nand");
    if (iVar2 == 0) {
      GateType = VER_GATE_NAND;
      goto LAB_002ea580;
    }
    iVar2 = strcmp(pcVar13,"nor");
    if (iVar2 == 0) {
      GateType = VER_GATE_NOR;
      goto LAB_002ea580;
    }
    iVar2 = strcmp(pcVar13,"xnor");
    if (iVar2 == 0) {
      GateType = VER_GATE_XNOR;
      goto LAB_002ea580;
    }
    iVar2 = strcmp(pcVar13,"not");
    if (iVar2 == 0) {
      GateType = VER_GATE_NOT;
      goto LAB_002ea580;
    }
    iVar2 = strcmp(pcVar13,"dff");
    if (iVar2 == 0) {
      iVar2 = Ver_ParseFlopStandard(pMan,pAVar14);
    }
    else {
      iVar2 = strcmp(pcVar13,"assign");
      if (iVar2 == 0) {
        iVar2 = Ver_ParseAssign(pMan,pAVar14);
      }
      else {
        iVar2 = strcmp(pcVar13,"always");
        if (iVar2 == 0) {
          iVar2 = Ver_ParseAlways(pMan,pAVar14);
        }
        else {
          iVar2 = strcmp(pcVar13,"initial");
          if (iVar2 == 0) {
            iVar2 = Ver_ParseInitial(pMan,pAVar14);
          }
          else {
            iVar2 = strcmp(pcVar13,"endmodule");
            if (iVar2 == 0) goto LAB_002ea62d;
            pLib = (Mio_Library_t *)pMan->pDesign->pGenlib;
            if ((pLib == (Mio_Library_t *)0x0) ||
               (pGate = Mio_LibraryReadGateByName(pLib,pcVar13,(char *)0x0),
               pGate == (Mio_Gate_t *)0x0)) {
              iVar2 = strcmp(pcVar13,"wire");
              if (iVar2 == 0) {
                iVar2 = Ver_ParseSignal(pMan,pAVar14,VER_SIG_WIRE);
              }
              else {
                pNtkBox = Ver_ParseFindOrCreateNetwork(pMan,pcVar13);
                iVar2 = Ver_ParseBox(pMan,pAVar14,pNtkBox);
              }
            }
            else {
              iVar2 = Ver_ParseGate(pMan,pAVar14,pGate);
            }
          }
        }
      }
    }
  }
  if (((iVar2 == 0) || (iVar2 = Ver_ParseSkipComments(pMan), iVar2 == 0)) ||
     (pcVar13 = Ver_ParseGetName(pMan), pcVar13 == (char *)0x0)) goto LAB_002ea97f;
  goto LAB_002ea39b;
LAB_002ea62d:
  if (pAVar14->ntkFunc == ABC_FUNC_BLACKBOX) {
    if ((pAVar14->nObjCounts[7] < 1) && (pAVar14->vBoxes->nSize < 1)) {
      pObj = Abc_NtkCreateObj(pAVar14,ABC_OBJ_BLACKBOX);
      if (0 < pAVar14->vPis->nSize) {
        iVar2 = 0;
        do {
          pAVar15 = Abc_NtkPi(pAVar14,iVar2);
          pAVar16 = Abc_NtkCreateObj(pAVar14,ABC_OBJ_BI);
          Abc_ObjAddFanin(pAVar16,(Abc_Obj_t *)
                                  pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanouts).pArray]);
          Abc_ObjAddFanin(pObj,pAVar16);
          iVar2 = iVar2 + 1;
        } while (iVar2 < pAVar14->vPis->nSize);
      }
      if (0 < pAVar14->vPos->nSize) {
        iVar2 = 0;
        do {
          pAVar15 = Abc_NtkPo(pAVar14,iVar2);
          pAVar16 = Abc_NtkCreateObj(pAVar14,ABC_OBJ_BO);
          Abc_ObjAddFanin(pAVar16,pObj);
          Abc_ObjAddFanin((Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray],
                          pAVar16);
          iVar2 = iVar2 + 1;
        } while (iVar2 < pAVar14->vPos->nSize);
      }
    }
    else {
      iVar2 = Ver_ParseConvertNetwork(pMan,pAVar14,pMan->fMapped);
      if (iVar2 == 0) goto LAB_002ea97f;
    }
  }
  Ver_ParseRemoveSuffixTable(pMan);
  pcVar13 = Ver_ParseGetName(pMan);
  if (pcVar13 == (char *)0x0) goto LAB_002ea766;
  goto LAB_002ea24d;
code_r0x002ea808:
  iVar4 = Ver_ParseDriveFormal(pMan,pAVar14,pBundle0);
  if (iVar4 == 0) goto LAB_002ea8bb;
  goto LAB_002ea7b9;
LAB_002ea8bb:
  uVar3 = 0;
  goto LAB_002ea8bd;
}

Assistant:

Abc_Des_t * Ver_ParseFile( char * pFileName, Abc_Des_t * pGateLib, int fCheck, int fUseMemMan )
{
    Ver_Man_t * p;
    Abc_Des_t * pDesign;
    // start the parser
    p = Ver_ParseStart( pFileName, pGateLib );
    p->fMapped    = glo_fMapped;
    p->fCheck     = fCheck;
    p->fUseMemMan = fUseMemMan;
    if ( glo_fMapped )
    {
        Hop_ManStop((Hop_Man_t *)p->pDesign->pManFunc);
        p->pDesign->pManFunc = NULL;
    }
    // parse the file
    Ver_ParseInternal( p );
    // save the result
    pDesign = p->pDesign;
    p->pDesign = NULL;
    // stop the parser
    Ver_ParseStop( p );
    return pDesign;
}